

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O0

int ztlex_fgetc(ztlex_t *lex)

{
  long lVar1;
  undefined8 *in_RDI;
  int c;
  int local_c;
  
  if (in_RDI + 2 < (undefined8 *)in_RDI[1]) {
    lVar1 = in_RDI[1];
    in_RDI[1] = lVar1 + -1;
    local_c = (int)*(char *)(lVar1 + -1);
  }
  else {
    local_c = fgetc((FILE *)*in_RDI);
  }
  if (local_c == 10) {
    *(int *)(in_RDI + 0x45) = *(int *)(in_RDI + 0x45) + 1;
    *(undefined4 *)(in_RDI + 0x46) = *(undefined4 *)((long)in_RDI + 0x22c);
    *(undefined4 *)((long)in_RDI + 0x22c) = 1;
  }
  else {
    *(int *)((long)in_RDI + 0x22c) = *(int *)((long)in_RDI + 0x22c) + 1;
  }
  return local_c;
}

Assistant:

static int ztlex_fgetc(ztlex_t *lex)
{
  int c;

  if (lex->ungottenptr > lex->ungotten)
    c = *--lex->ungottenptr;
  else
    c = fgetc(lex->file);

  if (c == '\n')
  {
    lex->line++;
    lex->prevcolumn = lex->column;
    lex->column     = 1;
  }
  else
  {
    lex->column++;
  }

  return c;
}